

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::add_function
          (Dispatch_Engine *this,Proxy_Function *t_f,string *t_name)

{
  Proxy_Function new_func;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  iterator itr;
  undefined1 auStack_68 [24];
  undefined1 local_50;
  Boxed_Value local_48;
  Proxy_Function *local_38;
  string *local_30;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_>_>_>
  local_28;
  
  local_50 = 0;
  auStack_68._16_8_ = this;
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::lock
            ((unique_lock<chaiscript::detail::threading::shared_mutex> *)(auStack_68 + 0x10));
  local_50 = 1;
  local_28 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>*,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>>>>,__gnu_cxx::__ops::_Iter_pred<chaiscript::detail::Dispatch_Engine::find_keyed_value<std::vector<std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>>>,std::__cxx11::string>(std::vector<std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>>>&,std::__cxx11::string_const&)::_lambda(std::pair<std::__cxx11::string,std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>>const&)_1_>>
                       ((this->m_state).m_functions.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (this->m_state).m_functions.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,t_name);
  local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->m_state;
  local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)&stack0xffffffffffffffd8;
  local_38 = t_f;
  local_30 = t_name;
  add_function::anon_class_32_4_605ca284::operator()((anon_class_32_4_605ca284 *)auStack_68);
  const_var_impl<chaiscript::dispatch::Proxy_Function_Base>
            ((detail *)&local_48,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)auStack_68
            );
  add_keyed_value<std::vector<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Boxed_Value>>>,std::__cxx11::string,chaiscript::Boxed_Value>
            (&(this->m_state).m_boxed_functions,t_name,&local_48);
  if (local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  add_keyed_value<std::vector<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>>>,std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            (&(this->m_state).m_function_objects,t_name,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)auStack_68);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_68._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_68._8_8_);
  }
  std::unique_lock<chaiscript::detail::threading::shared_mutex>::~unique_lock
            ((unique_lock<chaiscript::detail::threading::shared_mutex> *)(auStack_68 + 0x10));
  return;
}

Assistant:

void add_function(const Proxy_Function &t_f, const std::string &t_name)
        {
          chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

          auto &funcs = get_functions_int();

          auto itr = find_keyed_value(funcs, t_name);

          Proxy_Function new_func =
            [&]() -> Proxy_Function {
              if (itr != funcs.end())
              {
                auto vec = *itr->second;
                for (const auto &func : vec)
                {
                  if ((*t_f) == *(func))
                  {
                    throw chaiscript::exception::name_conflict_error(t_name);
                  }
                }

                vec.reserve(vec.size() + 1); // tightly control vec growth
                vec.push_back(t_f);
                std::stable_sort(vec.begin(), vec.end(), &function_less_than);
                itr->second = std::make_shared<std::vector<Proxy_Function>>(vec);
                return std::make_shared<Dispatch_Function>(std::move(vec));
              } else if (t_f->has_arithmetic_param()) {
                // if the function is the only function but it also contains
                // arithmetic operators, we must wrap it in a dispatch function
                // to allow for automatic arithmetic type conversions
                std::vector<Proxy_Function> vec({t_f});
                funcs.emplace_back(t_name, std::make_shared<std::vector<Proxy_Function>>(vec));
                return std::make_shared<Dispatch_Function>(std::move(vec));
              } else {
                funcs.emplace_back(t_name, std::make_shared<std::vector<Proxy_Function>>(std::initializer_list<Proxy_Function>({t_f})));
                return t_f;
              }
            }();

          add_keyed_value(get_boxed_functions_int(), t_name, const_var(new_func));
          add_keyed_value(get_function_objects_int(), t_name, std::move(new_func));
        }